

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O0

void anon_unknown.dwarf_3bf68::updateHelpers
               (TParameters *params,TClusterCount *clusterCount,TClusterPos *clusterPos,int nLetters
               ,int c0,int c1,TClusterToLetterMap *clMap,TPlainText *plainText,
               TLetterCount *letterCount,float *letterFreqCost)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference piVar7;
  const_reference pvVar8;
  int in_ECX;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_R8D;
  int in_R9D;
  float fVar9;
  double dVar10;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  float *in_stack_00000020;
  float curf;
  int i_2;
  array<float,_27UL> *freq;
  int *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  value_type *__range1_1;
  int *i;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  int nc1;
  int nc0;
  int p1;
  int p0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  array<float,_27UL> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  mapped_type mVar11;
  undefined4 in_stack_ffffffffffffff74;
  mapped_type mVar12;
  int local_84;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  const_reference local_60;
  reference local_58;
  int *local_50;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  const_reference local_40;
  int local_34;
  int local_30;
  mapped_type local_2c;
  mapped_type local_28;
  int local_24;
  int local_20;
  int local_1c;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (key_type_conflict *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_28 = *pmVar4;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      (key_type_conflict *)
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_2c = *pmVar4;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_20);
  local_30 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_24);
  local_34 = *pvVar5;
  iVar2 = local_34 - local_30;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000018,(long)local_28);
  *pvVar6 = iVar2 + *pvVar6;
  iVar3 = local_30 - local_34;
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000018,(long)local_2c);
  *pvVar6 = iVar3 + *pvVar6;
  mVar11 = local_2c;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffff74,local_2c),
                      (key_type_conflict *)CONCAT44(iVar3,iVar2));
  *pmVar4 = mVar11;
  mVar12 = local_28;
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(local_28,mVar11),(key_type_conflict *)CONCAT44(iVar3,iVar2));
  *pmVar4 = mVar12;
  local_40 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](local_18,(long)local_20);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_58 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
    mVar11 = local_2c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000010,(long)*local_58);
    *pvVar6 = mVar11;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_48);
  }
  local_60 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](local_18,(long)local_24);
  local_68._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_68);
    mVar11 = local_28;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000010,(long)*piVar7);
    *pvVar6 = mVar11;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_68);
  }
  *in_stack_00000020 = 0.0;
  for (local_84 = 0; local_84 < 0x1b; local_84 = local_84 + 1) {
    pvVar8 = std::array<float,_27UL>::operator[]
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 = (array<float,_27UL> *)(double)*pvVar8;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000018,(long)local_84);
    fVar9 = (float)((double)in_stack_ffffffffffffff50 * 0.01 +
                   -(double)((float)*pvVar6 / (float)local_1c));
    *in_stack_00000020 = fVar9 * fVar9 + *in_stack_00000020;
  }
  *in_stack_00000020 = *in_stack_00000020 / 27.0;
  dVar10 = sqrt((double)*in_stack_00000020);
  *in_stack_00000020 = (float)dVar10;
  return;
}

Assistant:

void updateHelpers(
        const Cipher::TParameters & params,
        const Cipher::TClusterCount & clusterCount,
        const Cipher::TClusterPos & clusterPos,
        const int nLetters,
        int c0, int c1,
        TClusterToLetterMap & clMap,
        Cipher::TPlainText & plainText,
        Cipher::TLetterCount & letterCount,
        float & letterFreqCost) {

    int p0 = clMap.at(c0);
    int p1 = clMap.at(c1);

    int nc0 = clusterCount[c0];
    int nc1 = clusterCount[c1];

    letterCount[p0] += nc1 - nc0;
    letterCount[p1] += nc0 - nc1;

    clMap.at(c0) = p1;
    clMap.at(c1) = p0;

    for (auto & i : clusterPos[c0]) plainText[i] = p1;
    for (auto & i : clusterPos[c1]) plainText[i] = p0;

    letterFreqCost = 0.0;
    {
        auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
        for (int i = 0; i < 27; ++i) {
            float curf = 0.01*freq[i] - ((float)(letterCount[i]))/((float)(nLetters));
            letterFreqCost += curf*curf;
        }
    }

    letterFreqCost /= 27.0;
    letterFreqCost = sqrt(letterFreqCost);
}